

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  XMLDocument *pXVar1;
  int iVar2;
  char *__s1;
  XMLAttribute *pXVar3;
  XMLAttribute **ppXVar4;
  MemPoolT<80> *pMVar5;
  XMLAttribute *pXVar6;
  
  pXVar3 = this->_rootAttribute;
  if (this->_rootAttribute == (XMLAttribute *)0x0) {
    pXVar6 = (XMLAttribute *)0x0;
  }
  else {
    do {
      pXVar6 = pXVar3;
      __s1 = StrPair::GetStr(&pXVar6->_name);
      if (__s1 == name) {
        return pXVar6;
      }
      iVar2 = strncmp(__s1,name,0x7fffffff);
      if (iVar2 == 0) {
        return pXVar6;
      }
      pXVar3 = pXVar6->_next;
    } while (pXVar6->_next != (XMLAttribute *)0x0);
  }
  pXVar3 = (XMLAttribute *)MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
  pXVar3->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00114bc0;
  (pXVar3->_name)._flags = 0;
  (pXVar3->_name)._start = (char *)0x0;
  (pXVar3->_name)._end = (char *)0x0;
  (pXVar3->_value)._flags = 0;
  (pXVar3->_value)._start = (char *)0x0;
  (pXVar3->_value)._end = (char *)0x0;
  pXVar3->_parseLineNum = 0;
  pXVar3->_next = (XMLAttribute *)0x0;
  pXVar3->_memPool = (MemPool *)0x0;
  pXVar1 = (this->super_XMLNode)._document;
  pMVar5 = &pXVar1->_attributePool;
  pXVar3->_memPool = &pMVar5->super_MemPool;
  (*(pXVar1->_attributePool).super_MemPool._vptr_MemPool[5])(pMVar5);
  ppXVar4 = &pXVar6->_next;
  if (pXVar6 == (XMLAttribute *)0x0) {
    ppXVar4 = &this->_rootAttribute;
  }
  *ppXVar4 = pXVar3;
  StrPair::SetStr(&pXVar3->_name,name,0);
  return pXVar3;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        attrib = CreateAttribute();
        TIXMLASSERT( attrib );
        if ( last ) {
            TIXMLASSERT( last->_next == 0 );
            last->_next = attrib;
        }
        else {
            TIXMLASSERT( _rootAttribute == 0 );
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
    }
    return attrib;
}